

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KrazyMeans.cpp
# Opt level: O2

void __thiscall KrazyMeans::printState(KrazyMeans *this,ostream *labels_out,ostream *centroids_out)

{
  element_type *peVar1;
  ostream *poVar2;
  size_t v;
  ulong uVar3;
  size_t c;
  long lVar4;
  string local_50;
  
  lVar4 = 0;
  for (uVar3 = 0;
      peVar1 = (this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      uVar3 < (ulong)(((long)*(pointer *)
                              ((long)&(peVar1->vectors).
                                      super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                                      _M_impl.super__Vector_impl_data + 8) -
                      (long)(peVar1->vectors).
                            super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)labels_out);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,", ");
    FeatureVec::toString_abi_cxx11_
              (&local_50,
               (FeatureVec *)
               ((long)(((this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4));
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_50);
    lVar4 = lVar4 + 0x18;
  }
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < this->num_clusters; uVar3 = uVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)centroids_out);
    poVar2 = std::operator<<(poVar2,", ");
    FeatureVec::toString_abi_cxx11_
              (&local_50,
               (FeatureVec *)
               ((long)&(((this->centroids).
                         super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
                         super__Vector_impl_data._M_start)->values).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl + lVar4));
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_50);
    lVar4 = lVar4 + 0x18;
  }
  return;
}

Assistant:

void KrazyMeans::printState(std::ostream &labels_out, std::ostream &centroids_out) {
  // Print labels for all vectors
  for (size_t v = 0; v < data_set->size(); v++) {
    labels_out << v << ", " << labels[v] << ", " << data_set->vector(v).toString() << std::endl;
  }

  // Print centroids
  for (size_t c = 0; c < num_clusters; c++) {
    centroids_out << c << ", " << centroids[c].toString() << std::endl;
  }
}